

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

void ngram_search_update_widmap(ngram_search_t *ngs)

{
  int n_words_00;
  char **words_00;
  char *local_28;
  int local_1c;
  int32 n_words;
  int32 i;
  char **words;
  ngram_search_t *ngs_local;
  
  n_words_00 = (ngs->base).n_words;
  words_00 = (char **)__ckd_calloc__((long)n_words_00,8,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ngram_search.c"
                                     ,0x53);
  for (local_1c = 0; local_1c < n_words_00; local_1c = local_1c + 1) {
    if (local_1c < 0) {
      local_28 = (char *)0x0;
    }
    else {
      local_28 = ((ngs->base).dict)->word[local_1c].word;
    }
    words_00[local_1c] = local_28;
  }
  ngram_model_set_map_words(ngs->lmset,words_00,n_words_00);
  ckd_free(words_00);
  return;
}

Assistant:

static void
ngram_search_update_widmap(ngram_search_t *ngs)
{
    char const **words;
    int32 i, n_words;

    /* It's okay to include fillers since they won't be in the LM */
    n_words = ps_search_n_words(ngs);
    words = (char const**)ckd_calloc(n_words, sizeof(*words));
    /* This will include alternates, again, that's okay since they aren't in the LM */
    for (i = 0; i < n_words; ++i)
        words[i] = dict_wordstr(ps_search_dict(ngs), i);
    ngram_model_set_map_words(ngs->lmset, words, n_words);
    ckd_free(words);
}